

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_audio_buffer_ref_map
                    (ma_audio_buffer_ref *pAudioBufferRef,void **ppFramesOut,ma_uint64 *pFrameCount)

{
  ulong uVar1;
  ma_result mVar2;
  ulong uVar3;
  
  if (ppFramesOut != (void **)0x0) {
    *ppFramesOut = (void *)0x0;
  }
  mVar2 = MA_INVALID_ARGS;
  if (pFrameCount != (ma_uint64 *)0x0) {
    uVar1 = *pFrameCount;
    *pFrameCount = 0;
    if (pAudioBufferRef != (ma_audio_buffer_ref *)0x0 && ppFramesOut != (void **)0x0) {
      uVar3 = pAudioBufferRef->sizeInFrames - pAudioBufferRef->cursor;
      if (uVar1 < uVar3) {
        uVar3 = uVar1;
      }
      *ppFramesOut = (void *)((ulong)(*(int *)(&DAT_00176420 + (ulong)pAudioBufferRef->format * 4) *
                                     pAudioBufferRef->channels) * pAudioBufferRef->cursor +
                             (long)pAudioBufferRef->pData);
      *pFrameCount = uVar3;
      mVar2 = MA_SUCCESS;
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_audio_buffer_ref_map(ma_audio_buffer_ref* pAudioBufferRef, void** ppFramesOut, ma_uint64* pFrameCount)
{
    ma_uint64 framesAvailable;
    ma_uint64 frameCount = 0;

    if (ppFramesOut != NULL) {
        *ppFramesOut = NULL;    /* Safety. */
    }

    if (pFrameCount != NULL) {
        frameCount = *pFrameCount;
        *pFrameCount = 0;       /* Safety. */
    }

    if (pAudioBufferRef == NULL || ppFramesOut == NULL || pFrameCount == NULL) {
        return MA_INVALID_ARGS;
    }

    framesAvailable = pAudioBufferRef->sizeInFrames - pAudioBufferRef->cursor;
    if (frameCount > framesAvailable) {
        frameCount = framesAvailable;
    }

    *ppFramesOut = ma_offset_ptr(pAudioBufferRef->pData, pAudioBufferRef->cursor * ma_get_bytes_per_frame(pAudioBufferRef->format, pAudioBufferRef->channels));
    *pFrameCount = frameCount;

    return MA_SUCCESS;
}